

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::checkPath
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *increments,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *decrements,int initialValue,
               TestSpec *spec)

{
  value_type vVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  uint *puVar5;
  reference pvVar6;
  int local_b8;
  int local_ac;
  int local_a4;
  int local_a0;
  int valueNdx_5;
  int valueNdx_4;
  int pos;
  int valueNdx_3;
  int valueNdx_2;
  uint local_88;
  uint local_84;
  int local_80;
  int valueNdx_1;
  int local_6c;
  uint local_68;
  int valueNdx;
  deUint32 maxValue;
  deUint32 minValue;
  vector<unsigned_int,_std::allocator<unsigned_int>_> decrementCounts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> incrementCounts;
  bool isOk;
  deUint32 lastValue;
  TestSpec *spec_local;
  int initialValue_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *decrements_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *increments_local;
  
  if ((spec->useBranches & 1U) == 0) {
    local_ac = 0;
  }
  else {
    local_ac = spec->threadCount * spec->callCount - (spec->threadCount * spec->callCount) / 2;
  }
  if ((spec->useBranches & 1U) == 0) {
    local_b8 = 0;
  }
  else {
    local_b8 = (spec->threadCount * spec->callCount) / 2;
  }
  local_b8 = (initialValue + local_ac) - local_b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &decrementCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&maxValue);
  valueNdx = -1;
  local_68 = 0;
  for (local_6c = 0; iVar2 = local_6c,
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(increments),
      iVar2 < (int)sVar3; local_6c = local_6c + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (increments,(long)local_6c);
    if (*pvVar4 != 0xffffffff) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (increments,(long)local_6c);
      puVar5 = std::min<unsigned_int>((uint *)&valueNdx,pvVar4);
      valueNdx = *puVar5;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (increments,(long)local_6c);
      puVar5 = std::max<unsigned_int>(&local_68,pvVar4);
      local_68 = *puVar5;
    }
  }
  for (local_80 = 0; iVar2 = local_80,
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(decrements),
      iVar2 < (int)sVar3; local_80 = local_80 + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (decrements,(long)local_80);
    if (*pvVar4 != 0xffffffff) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (decrements,(long)local_80);
      puVar5 = std::min<unsigned_int>((uint *)&valueNdx,pvVar4);
      valueNdx = *puVar5;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (decrements,(long)local_80);
      puVar5 = std::max<unsigned_int>(&local_68,pvVar4);
      local_68 = *puVar5;
    }
  }
  local_84 = initialValue;
  puVar5 = std::min<unsigned_int>((uint *)&valueNdx,&local_84);
  valueNdx = *puVar5;
  local_88 = initialValue;
  puVar5 = std::max<unsigned_int>(&local_68,&local_88);
  local_68 = *puVar5;
  valueNdx_2 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &decrementCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)((local_68 - valueNdx) + 1),
             (value_type_conflict4 *)&valueNdx_2);
  valueNdx_3 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&maxValue,
             (ulong)((local_68 - valueNdx) + 1),(value_type_conflict4 *)&valueNdx_3);
  for (pos = 0; sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(increments),
      pos < (int)sVar3; pos = pos + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (increments,(long)pos);
    if (*pvVar4 != 0xffffffff) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (increments,(long)pos);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &decrementCounts.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)(*pvVar4 - valueNdx));
      *pvVar6 = *pvVar6 + 1;
    }
  }
  for (valueNdx_4 = 0;
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(decrements),
      valueNdx_4 < (int)sVar3; valueNdx_4 = valueNdx_4 + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (decrements,(long)valueNdx_4);
    if (*pvVar4 != 0xffffffff) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (decrements,(long)valueNdx_4);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&maxValue,
                          (ulong)(*pvVar4 - valueNdx));
      *pvVar6 = *pvVar6 + 1;
    }
  }
  valueNdx_5 = initialValue - valueNdx;
  while( true ) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &decrementCounts.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)valueNdx_5);
    vVar1 = *pvVar6;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&maxValue,
                        (long)valueNdx_5);
    if (vVar1 + *pvVar6 == 0) break;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &decrementCounts.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)valueNdx_5);
    if ((*pvVar6 == 0) || (valueNdx_5 < local_b8 - valueNdx)) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&maxValue,
                          (long)valueNdx_5);
      if (*pvVar6 == 0) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &decrementCounts.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(long)valueNdx_5);
        if (*pvVar6 != 0) {
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              &decrementCounts.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(long)valueNdx_5);
          *pvVar6 = *pvVar6 - 1;
          valueNdx_5 = valueNdx_5 + 1;
        }
      }
      else {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&maxValue,
                            (long)valueNdx_5);
        *pvVar6 = *pvVar6 - 1;
        valueNdx_5 = valueNdx_5 + -1;
      }
    }
    else {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &decrementCounts.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)valueNdx_5);
      *pvVar6 = *pvVar6 - 1;
      valueNdx_5 = valueNdx_5 + 1;
    }
    if ((valueNdx_5 < 0) ||
       (sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &decrementCounts.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage), (int)sVar3 <= valueNdx_5))
    break;
  }
  incrementCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = valueNdx + valueNdx_5 == local_b8;
  for (local_a0 = 0;
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &decrementCounts.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage), local_a0 < (int)sVar3;
      local_a0 = local_a0 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &decrementCounts.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)local_a0);
    if (*pvVar6 != 0) {
      incrementCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = false;
    }
  }
  for (local_a4 = 0;
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&maxValue),
      local_a4 < (int)sVar3; local_a4 = local_a4 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&maxValue,
                        (long)local_a4);
    if (*pvVar6 != 0) {
      incrementCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = false;
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&maxValue);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &decrementCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return incrementCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._3_1_;
}

Assistant:

bool AtomicCounterTest::checkPath (const vector<deUint32>& increments, const vector<deUint32>& decrements, int initialValue, const TestSpec& spec)
{
	const deUint32		lastValue	= initialValue + (spec.useBranches ? spec.threadCount*spec.callCount - spec.threadCount*spec.callCount/2 : 0) - (spec.useBranches ? spec.threadCount*spec.callCount/2 : 0);
	bool				isOk		= true;

	vector<deUint32>	incrementCounts;
	vector<deUint32>	decrementCounts;

	deUint32			minValue = 0xFFFFFFFFu;
	deUint32			maxValue = 0;

	for (int valueNdx = 0; valueNdx < (int)increments.size(); valueNdx++)
	{
		if (increments[valueNdx] != (deUint32)-1)
		{
			minValue = std::min(minValue, increments[valueNdx]);
			maxValue = std::max(maxValue, increments[valueNdx]);
		}
	}

	for (int valueNdx = 0; valueNdx < (int)decrements.size(); valueNdx++)
	{
		if (decrements[valueNdx] != (deUint32)-1)
		{
			minValue = std::min(minValue, decrements[valueNdx]);
			maxValue = std::max(maxValue, decrements[valueNdx]);
		}
	}

	minValue = std::min(minValue, (deUint32)initialValue);
	maxValue = std::max(maxValue, (deUint32)initialValue);

	incrementCounts.resize(maxValue - minValue + 1, 0);
	decrementCounts.resize(maxValue - minValue + 1, 0);

	for (int valueNdx = 0; valueNdx < (int)increments.size(); valueNdx++)
	{
		if (increments[valueNdx] != (deUint32)-1)
			incrementCounts[increments[valueNdx] - minValue]++;
	}

	for (int valueNdx = 0; valueNdx < (int)decrements.size(); valueNdx++)
	{
		if (decrements[valueNdx] != (deUint32)-1)
			decrementCounts[decrements[valueNdx] - minValue]++;
	}

	int pos = initialValue - minValue;

	while (incrementCounts[pos] + decrementCounts[pos] != 0)
	{
		if (incrementCounts[pos] > 0 && pos >= (int)(lastValue - minValue))
		{
			// If can increment and incrementation would move us away from result value, increment
			incrementCounts[pos]--;
			pos++;
		}
		else if (decrementCounts[pos] > 0)
		{
			// If can, decrement
			decrementCounts[pos]--;
			pos--;
		}
		else if (incrementCounts[pos] > 0)
		{
			// If increment moves closer to result value and can't decrement, increment
			incrementCounts[pos]--;
			pos++;
		}
		else
			DE_ASSERT(false);

		if (pos < 0 || pos >= (int)incrementCounts.size())
			break;
	}

	if (minValue + pos != lastValue)
		isOk = false;

	for (int valueNdx = 0; valueNdx < (int)incrementCounts.size(); valueNdx++)
	{
		if (incrementCounts[valueNdx] != 0)
			isOk = false;
	}

	for (int valueNdx = 0; valueNdx < (int)decrementCounts.size(); valueNdx++)
	{
		if (decrementCounts[valueNdx] != 0)
			isOk = false;
	}

	return isOk;
}